

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ConstCastTestT<int>(void)

{
  if (ConstCastTestT<int>()::w == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::c == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::sc == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::uc == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::s == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::us == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::i == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::ui == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::l == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::ul == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::ll == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::ull == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::st == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::pt == '\0') {
    ConstCastTestT<int>();
  }
  if (ConstCastTestT<int>()::pl == '\0') {
    ConstCastTestT<int>();
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}